

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiBroker.cpp
# Opt level: O0

void __thiscall
helics::MultiBroker::addRoute(MultiBroker *this,route_id rid,int interfaceId,string_view routeInfo)

{
  bool bVar1;
  int *in_RCX;
  int in_EDX;
  undefined4 in_ESI;
  vector<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
  *in_RDI;
  route_id *in_R8;
  CommsInterface *in_stack_00000078;
  undefined1 in_stack_00000080 [16];
  route_id in_stack_00000094;
  int *in_stack_ffffffffffffffb0;
  route_id *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  if (in_EDX < 1) {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
                        *)0x1f45fb);
    if (bVar1) {
      CLI::std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>::
      operator->((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_> *
                 )0x1f4611);
      CommsInterface::addRoute(in_stack_00000078,in_stack_00000094,(string_view)in_stack_00000080);
      std::vector<std::pair<helics::route_id,int>,std::allocator<std::pair<helics::route_id,int>>>::
      emplace_back<helics::route_id&,int>
                ((vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>
                  *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                 in_stack_ffffffffffffffb0);
    }
  }
  else {
    bVar1 = isValidIndex<int,std::vector<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>,std::allocator<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>>>>
                      ((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),in_RDI);
    if (bVar1) {
      CLI::std::
      vector<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
      ::operator[]((vector<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
                    *)&in_RDI[0x9a].
                       super__Vector_base<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(long)(in_EDX + -1));
      CLI::std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>::
      operator->((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_> *
                 )0x1f46a9);
      CommsInterface::addRoute(in_stack_00000078,in_stack_00000094,(string_view)in_stack_00000080);
      std::vector<std::pair<helics::route_id,int>,std::allocator<std::pair<helics::route_id,int>>>::
      emplace_back<helics::route_id&,int&>
                ((vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>
                  *)CONCAT44(in_stack_ffffffffffffffc4,in_ESI),in_R8,in_RCX);
    }
  }
  return;
}

Assistant:

void MultiBroker::addRoute(route_id rid, int interfaceId, std::string_view routeInfo)
{
    if (interfaceId <= 0) {
        if (masterComm) {
            masterComm->addRoute(rid, routeInfo);
            routingTable.emplace_back(rid, 0);
        }
    } else {
        if (isValidIndex(interfaceId - 1, comms)) {
            comms[interfaceId - 1]->addRoute(rid, routeInfo);
            routingTable.emplace_back(rid, interfaceId);
        }
    }
}